

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_info.hpp
# Opt level: O1

uint16_t * __thiscall duckdb::DeleteInfo::GetRows(DeleteInfo *this)

{
  InternalException *this_00;
  string local_40;
  
  if (this->is_consecutive != true) {
    return this->rows;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"DeleteInfo is consecutive - rows are not accessible","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const uint16_t *GetRows() const {
		if (is_consecutive) {
			throw InternalException("DeleteInfo is consecutive - rows are not accessible");
		}
		return rows;
	}